

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructBuilder * __thiscall
capnp::_::PointerBuilder::initStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size)

{
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  WirePointer *pWVar1;
  BuilderArena *this_00;
  AllocateResult AVar2;
  WirePointer *ref;
  uint uVar3;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_3d;
  StructSize local_3c;
  ulong local_38;
  
  ref = this->pointer;
  segment = this->segment;
  AVar2.words = (word *)ref;
  AVar2.segment = segment;
  AVar4.words = (word *)ref;
  AVar4.segment = segment;
  capTable = this->capTable;
  local_38 = (ulong)((uint)size >> 0x10);
  uVar3 = ((uint)size >> 0x10) + ((uint)size & 0xffff);
  local_3c = size;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  if (uVar3 == 0) {
    (ref->offsetAndKind).value = 0xfffffffc;
  }
  else {
    pWVar1 = (WirePointer *)segment->pos;
    if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
               ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar1)) >> 3 <
         (long)(ulong)uVar3) ||
       (segment->pos = (word *)(pWVar1 + uVar3), pWVar1 == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
      uVar3 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar3 + 1,&local_3d);
      AVar4 = BuilderArena::allocate(this_00,uVar3);
      (ref->offsetAndKind).value =
           (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar4.segment)->super_SegmentReader).id.value;
      *(undefined4 *)&(AVar4.words)->content = 0;
      ref = (WirePointer *)(AVar4.words + 1);
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar1 - (long)ref) >> 1) & 0xfffffffc) - 4
      ;
      ref = pWVar1;
      AVar4 = AVar2;
    }
  }
  *(StructDataWordCount *)((long)&(AVar4.words)->content + 4) = local_3c.data;
  *(StructPointerCount *)((long)&(AVar4.words)->content + 6) = (StructPointerCount)local_38;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = ref;
  __return_storage_ptr__->pointers = ref + size.data;
  __return_storage_ptr__->dataSize = ((uint)size & 0xffff) << 6;
  __return_storage_ptr__->pointerCount = (StructPointerCount)local_38;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder PointerBuilder::initStruct(StructSize size) {
  return WireHelpers::initStructPointer(pointer, segment, capTable, size);
}